

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall
picojson::default_parse_context::
parse_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (default_parse_context *this,
          input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in)

{
  _storage _Var1;
  int iVar2;
  value *pvVar3;
  bool bVar4;
  string *out;
  value local_28;
  
  value::value(&local_28,3,false);
  pvVar3 = this->out_;
  iVar2 = pvVar3->type_;
  pvVar3->type_ = local_28.type_;
  _Var1 = pvVar3->u_;
  pvVar3->u_ = local_28.u_;
  local_28.type_ = iVar2;
  local_28.u_ = _Var1;
  value::clear(&local_28);
  out = value::get<std::__cxx11::string>(this->out_);
  bVar4 = _parse_string<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (out,in);
  return bVar4;
}

Assistant:

bool parse_string(input<Iter> &in) {
    *out_ = value(string_type, false);
    return _parse_string(out_->get<std::string>(), in);
  }